

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O0

void basisu::unpack_etc2_eac_r(void *p,color_rgba *pPixels,uint32_t c)

{
  etc2_eac_r11 eVar1;
  etc2_eac_r11 eVar2;
  int iVar3;
  uint64_t uVar4;
  uint in_EDX;
  long in_RSI;
  etc2_eac_r11 *in_RDI;
  int val;
  uint32_t sel;
  uint32_t shift;
  uint32_t x;
  uint32_t y;
  int table;
  int mul;
  int base;
  uint64_t sels;
  etc2_eac_r11 *pBlock;
  int local_4c;
  uint local_3c;
  uint local_38;
  
  uVar4 = etc2_eac_r11::get_sels(in_RDI);
  eVar1 = *in_RDI;
  if (((ulong)*in_RDI >> 0xc & 0xf) == 0) {
    local_4c = 1;
  }
  else {
    local_4c = ((uint)((ulong)*in_RDI >> 0xc) & 0xf) << 3;
  }
  eVar2 = *in_RDI;
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      iVar3 = clamp<int>((eVar1._0_4_ & 0xff) * 8 + 4 +
                         (char)g_etc2_eac_tables
                               [(ulong)((uint)(uVar4 >> (((char)local_38 + (char)local_3c * '\x04')
                                                         * -3 + 0x2dU & 0x3f)) & 7) +
                                (long)(int)(eVar2._1_4_ & 0xf) * 8] * local_4c,0,0x7ff);
      *(char *)(in_RSI + (ulong)(local_3c + local_38 * 4) * 4 + (ulong)in_EDX) =
           (char)((long)(iVar3 * 0xff + 0x3ff) / 0x7ff);
    }
  }
  return;
}

Assistant:

void unpack_etc2_eac_r(const void *p, color_rgba* pPixels, uint32_t c)
	{
		const etc2_eac_r11* pBlock = static_cast<const etc2_eac_r11*>(p);
		const uint64_t sels = pBlock->get_sels();

		const int base = (int)pBlock->m_base * 8 + 4;
		const int mul = pBlock->m_mul ? ((int)pBlock->m_mul * 8) : 1;
		const int table = (int)pBlock->m_table;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				const uint32_t shift = 45 - ((y + x * 4) * 3);
				
				const uint32_t sel = (uint32_t)((sels >> shift) & 7);
				
				int val = base + g_etc2_eac_tables[table][sel] * mul;
				val = clamp<int>(val, 0, 2047);

				// Convert to 8-bits with rounding
				//pPixels[x + y * 4].m_comps[c] = static_cast<uint8_t>((val * 255 + 1024) / 2047);
				pPixels[x + y * 4].m_comps[c] = static_cast<uint8_t>((val * 255 + 1023) / 2047);

			} // x
		} // y
	}